

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_19404::AckermannTask::start(AckermannTask *this,TaskInterface ti)

{
  TaskInterface local_40;
  int local_30;
  int local_2c;
  KeyType local_28;
  
  local_40.ctx = ti.ctx;
  local_40.impl = ti.impl;
  local_30 = this->m;
  if (local_30 != 0) {
    if (this->n == 0) {
      local_30 = local_30 + -1;
      local_2c = 1;
    }
    else {
      local_2c = this->n + -1;
    }
    (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
              (&local_28,(AckermannKey *)&local_30);
    llbuild::core::TaskInterface::request(&local_40,&local_28,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28.key._M_dataplus._M_p != &local_28.key.field_2) {
      operator_delete(local_28.key._M_dataplus._M_p,local_28.key.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

virtual void start(core::TaskInterface ti) override {
    // Request the first recursive result, if necessary.
    if (m == 0) {
      ;
    } else if (n == 0) {
      ti.request(AckermannKey(m-1, 1), 0);
    } else {
      ti.request(AckermannKey(m, n-1), 0);
    }
  }